

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lb.cpp
# Opt level: O1

void __thiscall zmq::lb_t::~lb_t(lb_t *this)

{
  pointer pppVar1;
  
  if ((this->_pipes)._items.super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->_pipes)._items.super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_pipes.empty ()",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/lb.cpp"
            ,0x2a);
    fflush(_stderr);
    zmq_abort("_pipes.empty ()");
  }
  pppVar1 = (this->_pipes)._items.super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (pppVar1 != (pointer)0x0) {
    operator_delete(pppVar1,(long)(this->_pipes)._items.
                                  super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pppVar1)
    ;
    return;
  }
  return;
}

Assistant:

zmq::lb_t::~lb_t ()
{
    zmq_assert (_pipes.empty ());
}